

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwht4x4_sse4_1(int16_t *input,tran_low_t *output,int stride)

{
  int iVar1;
  int iVar2;
  int iVar6;
  int iVar7;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  int iVar8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar14 [16];
  int iVar18;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar19 [16];
  
  auVar3 = pmovsxwd(in_XMM0,*(undefined8 *)input);
  auVar11 = pmovsxwd(in_XMM2,*(undefined8 *)(input + stride));
  auVar9 = pmovsxwd(in_XMM1,*(undefined8 *)(input + stride * 2));
  auVar12 = pmovsxwd(in_XMM3,*(undefined8 *)(input + stride * 3));
  iVar1 = 1;
  do {
    iVar2 = auVar3._0_4_ + auVar11._0_4_;
    iVar6 = auVar3._4_4_ + auVar11._4_4_;
    iVar7 = auVar3._8_4_ + auVar11._8_4_;
    iVar8 = auVar3._12_4_ + auVar11._12_4_;
    iVar13 = auVar12._0_4_ - auVar9._0_4_;
    iVar15 = auVar12._4_4_ - auVar9._4_4_;
    iVar16 = auVar12._8_4_ - auVar9._8_4_;
    iVar17 = auVar12._12_4_ - auVar9._12_4_;
    iVar18 = iVar2 - iVar13 >> 1;
    iVar20 = iVar6 - iVar15 >> 1;
    iVar21 = iVar7 - iVar16 >> 1;
    iVar22 = iVar8 - iVar17 >> 1;
    auVar12._0_4_ = iVar18 - auVar11._0_4_;
    auVar12._4_4_ = iVar20 - auVar11._4_4_;
    auVar12._8_4_ = iVar21 - auVar11._8_4_;
    auVar12._12_4_ = iVar22 - auVar11._12_4_;
    auVar11._0_4_ = iVar18 - auVar9._0_4_;
    auVar11._4_4_ = iVar20 - auVar9._4_4_;
    auVar11._8_4_ = iVar21 - auVar9._8_4_;
    auVar11._12_4_ = iVar22 - auVar9._12_4_;
    iVar2 = iVar2 - auVar11._0_4_;
    iVar6 = iVar6 - auVar11._4_4_;
    auVar4._0_8_ = CONCAT44(iVar6,iVar2);
    auVar4._8_4_ = iVar7 - auVar11._8_4_;
    auVar4._12_4_ = iVar8 - auVar11._12_4_;
    iVar13 = iVar13 + auVar12._0_4_;
    iVar15 = iVar15 + auVar12._4_4_;
    auVar9._0_8_ = CONCAT44(iVar15,iVar13);
    auVar9._8_4_ = iVar16 + auVar12._8_4_;
    auVar9._12_4_ = iVar17 + auVar12._12_4_;
    auVar3 = auVar4;
    if (iVar1 == 1) {
      auVar14._8_4_ = iVar6;
      auVar14._0_8_ = auVar4._0_8_;
      auVar14._12_4_ = auVar11._4_4_;
      auVar3._4_4_ = auVar11._0_4_;
      auVar3._0_4_ = iVar2;
      auVar19._8_4_ = iVar15;
      auVar19._0_8_ = auVar9._0_8_;
      auVar19._12_4_ = auVar12._4_4_;
      auVar3._12_4_ = auVar12._0_4_;
      auVar3._8_4_ = iVar13;
      auVar5._0_8_ = CONCAT44(auVar11._8_4_,auVar4._8_4_);
      auVar5._8_4_ = auVar4._12_4_;
      auVar5._12_4_ = auVar11._12_4_;
      auVar10._0_8_ = CONCAT44(auVar12._8_4_,auVar9._8_4_);
      auVar10._8_4_ = auVar9._12_4_;
      auVar10._12_4_ = auVar12._12_4_;
      auVar11._8_8_ = auVar19._8_8_;
      auVar11._0_8_ = auVar14._8_8_;
      auVar9._8_8_ = auVar10._0_8_;
      auVar9._0_8_ = auVar5._0_8_;
      auVar12._8_8_ = auVar10._8_8_;
      auVar12._0_8_ = auVar5._8_8_;
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  *output = auVar3._0_4_ << 2;
  output[1] = auVar3._4_4_ << 2;
  output[2] = auVar3._8_4_ << 2;
  output[3] = auVar3._12_4_ << 2;
  output[4] = auVar11._0_4_ << 2;
  output[5] = auVar11._4_4_ << 2;
  output[6] = auVar11._8_4_ << 2;
  output[7] = auVar11._12_4_ << 2;
  output[8] = auVar9._0_4_ << 2;
  output[9] = auVar9._4_4_ << 2;
  output[10] = auVar9._8_4_ << 2;
  output[0xb] = auVar9._12_4_ << 2;
  output[0xc] = auVar12._0_4_ << 2;
  output[0xd] = auVar12._4_4_ << 2;
  output[0xe] = auVar12._8_4_ << 2;
  output[0xf] = auVar12._12_4_ << 2;
  return;
}

Assistant:

void av1_fwht4x4_sse4_1(const int16_t *input, tran_low_t *output, int stride) {
  __m128i in[4];
  in[0] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  in[1] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
  in[2] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
  in[3] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));

  // Convert to int32_t.
  __m128i op[4];
  op[0] = _mm_cvtepi16_epi32(in[0]);
  op[1] = _mm_cvtepi16_epi32(in[1]);
  op[2] = _mm_cvtepi16_epi32(in[2]);
  op[3] = _mm_cvtepi16_epi32(in[3]);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i b1 = op[1];
    __m128i c1 = op[2];
    __m128i d1 = op[3];
    __m128i e1;

    a1 = _mm_add_epi32(a1, b1);  // a1 += b1
    d1 = _mm_sub_epi32(d1, c1);  // d1 = d1 - c1
    e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, c1);  // a1 -= c1
    d1 = _mm_add_epi32(d1, b1);  // d1 += b1

    op[0] = a1;
    op[1] = c1;
    op[2] = d1;
    op[3] = b1;

    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  op[0] = _mm_slli_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_slli_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_slli_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_slli_epi32(op[3], UNIT_QUANT_SHIFT);

  _mm_storeu_si128((__m128i *)(output + 0), op[0]);
  _mm_storeu_si128((__m128i *)(output + 4), op[1]);
  _mm_storeu_si128((__m128i *)(output + 8), op[2]);
  _mm_storeu_si128((__m128i *)(output + 12), op[3]);
}